

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void test_fast_strcpy(void)

{
  size_t sVar1;
  char dest [32];
  char *src;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe6;
  char in_stack_ffffffffffffffe7;
  char *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  
  memset(&stack0xffffffffffffffd8,0,0x20);
  sVar1 = strlen("rtosc is a good library");
  (&stack0xffffffffffffffd9)[sVar1] = 0x78;
  fast_strcpy((char *)CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
              (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0x101ca0);
  assert_str_eq(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                (char *)CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
                in_stack_ffffffffffffffdc);
  fast_strcpy((char *)CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
              (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0x101ccb);
  strlen("rtosc is a good library");
  assert_char_eq(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6,
                 (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  fast_strcpy((char *)CONCAT17(in_stack_ffffffffffffffe7,
                               CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
              (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0x101d02);
  assert_str_eq(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                (char *)CONCAT17(in_stack_ffffffffffffffe7,
                                 CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
                in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void test_fast_strcpy()
{
    const char* src = "rtosc is a good library";
    char dest[32];
    memset(dest, 0, sizeof(dest));
    dest[strlen(src)+1] = 'x';

    fast_strcpy(dest, src, 32);
    assert_str_eq(src, dest,
                  "fast_strcpy() copies at most <strlen> bytes", __LINE__);

    fast_strcpy(dest, src, 32);
    assert_char_eq('x', dest[strlen(src)+1],
                  "fast_strcpy() does not pad the dest with zeros", __LINE__);

    fast_strcpy(dest, src, 6);
    assert_str_eq("rtosc", dest,
                  "fast_strcpy() copies at most <buffersize> bytes", __LINE__);
}